

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O3

QString * __thiscall
QDBusXmlToCpp::propertyGetter
          (QString *__return_storage_ptr__,QDBusXmlToCpp *this,Property *property)

{
  qsizetype qVar1;
  Data *pDVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  char16_t cVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  Annotation local_118;
  QString local_d8;
  Annotation local_b8;
  Annotation local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.value.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.name.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.name.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.name.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.location.lineNumber = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  local_78.location.columnNumber = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  QVar9.m_data = (storage_type_conflict *)0x23;
  QVar9.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar9);
  local_118.location.lineNumber = local_b8.location.lineNumber;
  local_118.location.columnNumber = local_b8.location.columnNumber;
  local_118.name.d.d = local_b8.name.d.d;
  local_b8.location.lineNumber = 1;
  local_b8.location.columnNumber = 0;
  local_b8.name.d.d = (Data *)0x0;
  local_b8.name.d.ptr = (char16_t *)0x0;
  local_b8.name.d.size = 0;
  local_b8.value.d.d = (Data *)0x0;
  local_b8.value.d.ptr = (char16_t *)0x0;
  local_b8.value.d.size = 0;
  QMap<QString,_QDBusIntrospection::Annotation>::value
            (&local_78,&property->annotations,(QString *)&local_118,&local_b8);
  if (&(local_b8.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_118.location.lineNumber != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_118.location.lineNumber)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_118.location.lineNumber)->_q_value).super___atomic_base<int>.
         _M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_118.location.lineNumber)->_q_value).super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate((QArrayData *)local_118.location.lineNumber,2,0x10);
    }
  }
  if ((undefined1 *)local_78.value.d.size != (undefined1 *)0x0) {
    (__return_storage_ptr__->d).d = local_78.value.d.d;
    (__return_storage_ptr__->d).ptr = local_78.value.d.ptr;
    (__return_storage_ptr__->d).size = local_78.value.d.size;
    if (&(local_78.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00105801;
  }
  QVar10.m_data = (storage_type_conflict *)0x23;
  QVar10.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar10);
  local_d8.d.d = (Data *)local_b8.location.lineNumber;
  local_d8.d.ptr = (char16_t *)local_b8.location.columnNumber;
  local_d8.d.size = (qsizetype)local_b8.name.d.d;
  local_118.location.lineNumber = 1;
  local_118.location.columnNumber = 0;
  local_118.name.d.d = (Data *)0x0;
  local_118.name.d.ptr = (char16_t *)0x0;
  local_118.name.d.size = 0;
  local_118.value.d.d = (Data *)0x0;
  local_118.value.d.ptr = (char16_t *)0x0;
  local_118.value.d.size = 0;
  QMap<QString,_QDBusIntrospection::Annotation>::value
            (&local_b8,&property->annotations,&local_d8,&local_118);
  pcVar5 = local_78.value.d.ptr;
  pDVar4 = local_78.value.d.d;
  qVar3 = local_78.name.d.size;
  pcVar8 = local_78.name.d.ptr;
  pDVar2 = local_78.name.d.d;
  qVar1 = local_b8.value.d.size;
  pDVar7 = local_b8.value.d.d;
  local_78.location.lineNumber = local_b8.location.lineNumber;
  local_78.location.columnNumber = local_b8.location.columnNumber;
  local_78.name.d.d = local_b8.name.d.d;
  local_78.name.d.ptr = local_b8.name.d.ptr;
  local_b8.name.d.d = pDVar2;
  local_b8.name.d.ptr = pcVar8;
  local_78.name.d.size = local_b8.name.d.size;
  local_b8.name.d.size = qVar3;
  local_b8.value.d.d = local_78.value.d.d;
  local_78.value.d.d = pDVar7;
  local_78.value.d.ptr = local_b8.value.d.ptr;
  local_b8.value.d.ptr = pcVar5;
  local_b8.value.d.size = local_78.value.d.size;
  local_78.value.d.size = qVar1;
  if (&pDVar4->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&pDVar4->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_118.value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((undefined1 *)local_78.value.d.size != (undefined1 *)0x0) {
    DiagnosticsReporter::warning
              (&this->reporter,&local_78.location,
               "deprecated annotation \'com.trolltech.QtDBus.propertyGetter\' found\n");
    DiagnosticsReporter::note
              (&this->reporter,&local_78.location,
               "suggest updating to \'org.qtproject.QtDBus.PropertyGetter\'\n");
    (__return_storage_ptr__->d).d = local_78.value.d.d;
    (__return_storage_ptr__->d).ptr = local_78.value.d.ptr;
    (__return_storage_ptr__->d).size = local_78.value.d.size;
    if (&(local_78.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    goto LAB_00105801;
  }
  pDVar7 = (property->name).d.d;
  (__return_storage_ptr__->d).d = pDVar7;
  (__return_storage_ptr__->d).ptr = (property->name).d.ptr;
  (__return_storage_ptr__->d).size = (property->name).d.size;
  if (pDVar7 == (Data *)0x0) {
LAB_001057b8:
    QString::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
    pDVar7 = (__return_storage_ptr__->d).d;
  }
  else {
    LOCK();
    (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    pDVar7 = (__return_storage_ptr__->d).d;
    if ((pDVar7 == (Data *)0x0) ||
       (1 < (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i))
    goto LAB_001057b8;
  }
  pcVar8 = (__return_storage_ptr__->d).ptr;
  cVar6 = QChar::toLower((uint)(ushort)*pcVar8);
  if ((pDVar7 == (Data *)0x0) ||
     (1 < (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QString::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
    pcVar8 = (__return_storage_ptr__->d).ptr;
  }
  *pcVar8 = cVar6;
LAB_00105801:
  if (&(local_78.value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QDBusXmlToCpp::propertyGetter(const QDBusIntrospection::Property &property)
{
    auto annotation = property.annotations.value("org.qtproject.QtDBus.PropertyGetter"_L1);
    if (!annotation.value.isEmpty())
        return annotation.value;

    annotation = property.annotations.value("com.trolltech.QtDBus.propertyGetter"_L1);
    if (!annotation.value.isEmpty()) {
        reporter.warning(annotation.location,
                         "deprecated annotation 'com.trolltech.QtDBus.propertyGetter' found\n");
        reporter.note(annotation.location,
                      "suggest updating to 'org.qtproject.QtDBus.PropertyGetter'\n");
        return annotation.value;
    }

    QString getter = property.name;
    getter[0] = getter[0].toLower();
    return getter;
}